

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<char,_QByteArray>,_QByteArray>,_char>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<char,_QByteArray>,_QByteArray>,_char> *this)

{
  char *size;
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  
  size = (char *)((this->a).a.b.d.size + 2 + (this->a).b.d.size);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(qsizetype)size,Uninitialized);
  pcVar1 = (__return_storage_ptr__->d).ptr;
  *pcVar1 = (this->a).a.a;
  sVar2 = (this->a).a.b.d.size;
  if (sVar2 != 0) {
    memcpy(pcVar1 + 1,(this->a).a.b.d.ptr,sVar2);
  }
  __dest = pcVar1 + 1 + sVar2;
  sVar2 = (this->a).b.d.size;
  if (sVar2 != 0) {
    memcpy(__dest,(this->a).b.d.ptr,sVar2);
  }
  __dest[sVar2] = this->b;
  if (size != __dest + (sVar2 - (long)pcVar1) + 1) {
    QByteArray::resize(__return_storage_ptr__,(qsizetype)(__dest + (sVar2 - (long)pcVar1) + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }